

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_set_implemented(lys_module *module)

{
  int iVar1;
  LY_ERR *pLVar2;
  bool bVar3;
  bool bVar4;
  int local_30;
  int disabled;
  int j;
  int i;
  unres_schema *unres;
  ly_ctx *ctx;
  lys_module *module_local;
  
  ctx = (ly_ctx *)module;
  if (module == (lys_module *)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    module_local._4_4_ = 1;
  }
  else {
    ctx = (ly_ctx *)lys_main_module(module);
    bVar3 = ((byte)(ctx->dict).recs[2].field_0x10 >> 6 & 1) != 0;
    if (bVar3) {
      lys_set_enabled((lys_module *)ctx);
    }
    if ((char)(ctx->dict).recs[2].field_0x10 < '\0') {
      module_local._4_4_ = 0;
    }
    else {
      unres = (unres_schema *)(ctx->dict).recs[0].next;
      for (disabled = 0; disabled < *(int *)&unres[0x267].field_0x24; disabled = disabled + 1) {
        if (((ctx != (ly_ctx *)unres[0x268].item[disabled]) &&
            (iVar1 = strcmp((ctx->dict).recs[0].value,
                            *(char **)((long)unres[0x268].item[disabled] + 8)), iVar1 == 0)) &&
           (*(char *)((long)unres[0x268].item[disabled] + 0x40) < '\0')) {
          pLVar2 = ly_errno_location();
          *pLVar2 = LY_EINVAL;
          ly_log(LY_LLERR,"Module \"%s\" in another revision already implemented.",
                 (ctx->dict).recs[0].value);
          if (bVar3) {
            lys_set_disabled((lys_module *)ctx);
          }
          return 1;
        }
      }
      _j = (unres_schema *)calloc(1,0x28);
      if (_j == (unres_schema *)0x0) {
        pLVar2 = ly_errno_location();
        *pLVar2 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_set_implemented");
        if (bVar3) {
          lys_set_disabled((lys_module *)ctx);
        }
        module_local._4_4_ = 1;
      }
      else {
        (ctx->dict).recs[2].field_0x10 = (ctx->dict).recs[2].field_0x10 & 0x7f | 0x80;
        iVar1 = lys_set_implemented_recursion((lys_module *)ctx,_j);
        if (iVar1 == 0) {
          disabled = 0;
          while( true ) {
            bVar4 = false;
            if (disabled < (int)(uint)(byte)(ctx->dict).recs[2].field_0x13) {
              bVar4 = (ctx->dict).recs[4].next[(long)disabled * 2].next != (dict_rec *)0x0;
            }
            if (!bVar4) break;
            for (local_30 = 0;
                local_30 <
                (int)(uint)*(byte *)&(ctx->dict).recs[4].next[(long)disabled * 2].next[3].next;
                local_30 = local_30 + 1) {
              if ((*(long *)((ctx->dict).recs[4].next[(long)disabled * 2].next[5].value +
                            (long)local_30 * 0x68 + 0x58) == 0) &&
                 (iVar1 = unres_schema_add_node
                                    ((lys_module *)(ctx->dict).recs[4].next[(long)local_30 * 2].next
                                     ,_j,(ctx->dict).recs[4].next[(long)disabled * 2].next[5].value
                                         + (long)local_30 * 0x68,UNRES_AUGMENT,(lys_node *)0x0),
                 iVar1 == -1)) goto LAB_001837fc;
            }
            disabled = disabled + 1;
          }
          if ((_j->count == 0) || (iVar1 = resolve_unres_schema((lys_module *)ctx,_j), iVar1 == 0))
          {
            unres_schema_free((lys_module *)ctx,(unres_schema **)&j);
            return 0;
          }
        }
LAB_001837fc:
        if (bVar3) {
          lys_set_disabled((lys_module *)ctx);
        }
        (ctx->dict).recs[2].field_0x10 = (ctx->dict).recs[2].field_0x10 & 0x7f;
        unres_schema_free((lys_module *)ctx,(unres_schema **)&j);
        module_local._4_4_ = 1;
      }
    }
  }
  return module_local._4_4_;
}

Assistant:

API int
lys_set_implemented(const struct lys_module *module)
{
    struct ly_ctx *ctx;
    struct unres_schema *unres;
    int i, j, disabled = 0;

    if (!module) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    module = lys_main_module(module);

    if (module->disabled) {
        disabled = 1;
        lys_set_enabled(module);
    }

    if (module->implemented) {
        return EXIT_SUCCESS;
    }

    ctx = module->ctx;

    for (i = 0; i < ctx->models.used; ++i) {
        if (module == ctx->models.list[i]) {
            continue;
        }

        if (!strcmp(module->name, ctx->models.list[i]->name) && ctx->models.list[i]->implemented) {
            LOGERR(LY_EINVAL, "Module \"%s\" in another revision already implemented.", module->name);
            if (disabled) {
                /* set it back disabled */
                lys_set_disabled(module);
            }
            return EXIT_FAILURE;
        }
    }

    unres = calloc(1, sizeof *unres);
    if (!unres) {
        LOGMEM;
        if (disabled) {
            /* set it back disabled */
            lys_set_disabled(module);
        }
        return EXIT_FAILURE;
    }
    /* recursively make the module implemented */
    ((struct lys_module *)module)->implemented = 1;
    if (lys_set_implemented_recursion((struct lys_module *)module, unres)) {
        goto error;
    }
    /* process augments in submodules */
    for (i = 0; i < module->inc_size && module->inc[i].submodule; ++i) {
        for (j = 0; j < module->inc[i].submodule->augment_size; j++) {
            /* apply augment */
            if (!module->inc[i].submodule->augment[j].target
                    && (unres_schema_add_node((struct lys_module *)module->inc[j].submodule, unres,
                                              &module->inc[i].submodule->augment[j], UNRES_AUGMENT, NULL) == -1)) {

                goto error;
            }
        }
    }
    /* try again resolve augments in other modules possibly augmenting this one,
     * since we have just enabled it
     */
    /* resolve rest of unres items */
    if (unres->count && resolve_unres_schema((struct lys_module *)module, unres)) {
        goto error;
    }
    unres_schema_free((struct lys_module *)module, &unres);

    return EXIT_SUCCESS;

error:

    if (disabled) {
        /* set it back disabled */
        lys_set_disabled(module);
    }

    ((struct lys_module *)module)->implemented = 0;
    unres_schema_free((struct lys_module *)module, &unres);
    return EXIT_FAILURE;
}